

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * CreateLiteralCopy(ExpressionContext *ctx,SynBase *source,ExprBase *value)

{
  undefined1 uVar1;
  TypeBase *pTVar2;
  _func_int **pp_Var3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ExprBase *pEVar6;
  ExprBase *pEVar5;
  
  if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 3)) {
    pEVar6 = (ExprBase *)0x0;
  }
  if (pEVar6 == (ExprBase *)0x0) {
    if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 4)) {
      pEVar6 = (ExprBase *)0x0;
    }
    if (pEVar6 == (ExprBase *)0x0) {
      if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 6)) {
        pEVar6 = (ExprBase *)0x0;
      }
      if (pEVar6 == (ExprBase *)0x0) {
        if ((value == (ExprBase *)0x0) || (value->typeID != 7)) {
          value = (ExprBase *)0x0;
        }
        if (value == (ExprBase *)0x0) {
          anon_unknown.dwarf_9fd58::Stop(ctx,source,"ERROR: unknown literal type");
        }
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar5 = (ExprBase *)CONCAT44(extraout_var_02,iVar4);
        pTVar2 = value->type;
        pp_Var3 = value[1]._vptr_ExprBase;
        pEVar5->typeID = 7;
        pEVar5->source = source;
        pEVar5->type = pTVar2;
        pEVar5->next = (ExprBase *)0x0;
        pEVar5->listed = false;
        pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229548;
        pEVar5[1]._vptr_ExprBase = pp_Var3;
      }
      else {
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar5 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
        pTVar2 = pEVar6->type;
        pp_Var3 = pEVar6[1]._vptr_ExprBase;
        pEVar5->typeID = 6;
        pEVar5->source = source;
        pEVar5->type = pTVar2;
        pEVar5->next = (ExprBase *)0x0;
        pEVar5->listed = false;
        pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229510;
        pEVar5[1]._vptr_ExprBase = pp_Var3;
      }
    }
    else {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
      pTVar2 = pEVar6->type;
      uVar1 = pEVar6->field_0x29;
      pEVar5->typeID = 4;
      pEVar5->source = source;
      pEVar5->type = pTVar2;
      pEVar5->next = (ExprBase *)0x0;
      pEVar5->listed = false;
      pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002294d8;
      pEVar5->field_0x29 = uVar1;
    }
  }
  else {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
    pTVar2 = pEVar6->type;
    uVar1 = pEVar6->field_0x29;
    pEVar5->typeID = 3;
    pEVar5->source = source;
    pEVar5->type = pTVar2;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002294a0;
    pEVar5->field_0x29 = uVar1;
  }
  return pEVar5;
}

Assistant:

ExprBase* CreateLiteralCopy(ExpressionContext &ctx, SynBase *source, ExprBase *value)
{
	if(ExprBoolLiteral *node = getType<ExprBoolLiteral>(value))
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, node->type, node->value);

	if(ExprCharacterLiteral *node = getType<ExprCharacterLiteral>(value))
		return new (ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(source, node->type, node->value);

	if(ExprIntegerLiteral *node = getType<ExprIntegerLiteral>(value))
		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, node->type, node->value);

	if(ExprRationalLiteral *node = getType<ExprRationalLiteral>(value))
		return new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, node->type, node->value);

	Stop(ctx, source, "ERROR: unknown literal type");

	return NULL;
}